

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Gia_ManSuperCollect(Gia_Man_t *p,Gia_Obj_t *pObj,int fStrict)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  
  if (p->vSuper == (Vec_Int_t *)0x0) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 1000;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(4000);
    pVVar4->pArray = piVar5;
    p->vSuper = pVVar4;
  }
  else {
    p->vSuper->nSize = 0;
  }
  uVar1 = *(ulong *)pObj;
  uVar3 = (uint)uVar1;
  uVar6 = uVar1 & 0x1fffffff;
  if (uVar6 != 0x1fffffff && -1 < (int)uVar3) {
    uVar7 = (uint)(uVar1 >> 0x20);
    if ((uVar3 & 0x1fffffff) < (uVar7 & 0x1fffffff)) {
      if ((uVar1 & 0x2000000020000000) != 0) {
        __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalAig.c"
                      ,0xa8,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *, int)");
      }
      Gia_ManSuperCollectXor_rec(p,pObj + -uVar6,fStrict);
      Gia_ManSuperCollectXor_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),fStrict);
      qsort(p->vSuper->pArray,(long)p->vSuper->nSize,4,Vec_IntSortCompare1);
      Gia_ManSimplifyXor(p->vSuper);
LAB_006fe2f4:
      if (0 < p->vSuper->nSize) {
        return;
      }
      __assert_fail("Vec_IntSize(p->vSuper) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalAig.c"
                    ,0xbe,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *, int)");
    }
    if ((uVar6 != 0x1fffffff && -1 < (int)uVar3) && ((uVar7 & 0x1fffffff) < (uVar3 & 0x1fffffff))) {
      pGVar2 = p->pObjs;
      if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      if ((p->pMuxes == (uint *)0x0) ||
         (p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555] == 0)) {
        Gia_ManSuperCollectAnd_rec
                  (p,(Gia_Obj_t *)((ulong)(uVar3 >> 0x1d & 1) ^ (ulong)(pObj + -uVar6)),fStrict);
        uVar3 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
        Gia_ManSuperCollectAnd_rec
                  (p,(Gia_Obj_t *)
                     ((ulong)(uVar3 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar3 & 0x1fffffff))),
                   fStrict);
        qsort(p->vSuper->pArray,(long)p->vSuper->nSize,4,Vec_IntSortCompare1);
        Gia_ManSimplifyAnd(p->vSuper);
        goto LAB_006fe2f4;
      }
    }
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalAig.c"
                ,0xbb,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *, int)");
}

Assistant:

void Gia_ManSuperCollect( Gia_Man_t * p, Gia_Obj_t * pObj, int fStrict )
{
//    int nSize;
    if ( p->vSuper == NULL )
        p->vSuper = Vec_IntAlloc( 1000 );
    else
        Vec_IntClear( p->vSuper );
    if ( Gia_ObjIsXor(pObj) )
    {
        assert( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) );
        Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin0(pObj), fStrict );
        Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin1(pObj), fStrict );
//        nSize = Vec_IntSize(vSuper);
        Vec_IntSort( p->vSuper, 0 );
        Gia_ManSimplifyXor( p->vSuper );
//        if ( nSize != Vec_IntSize(vSuper) )
//            printf( "X %d->%d  ", nSize, Vec_IntSize(vSuper) );
    }
    else if ( Gia_ObjIsAndReal(p, pObj) )
    {
        Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild0(pObj), fStrict );
        Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild1(pObj), fStrict );
//        nSize = Vec_IntSize(vSuper);
        Vec_IntSort( p->vSuper, 0 );
        Gia_ManSimplifyAnd( p->vSuper );
//        if ( nSize != Vec_IntSize(vSuper) )
//            printf( "A %d->%d  ", nSize, Vec_IntSize(vSuper) );
    }
    else assert( 0 );
//    if ( nSize > 10 )
//        printf( "%d ", nSize );
    assert( Vec_IntSize(p->vSuper) > 0 );
}